

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *this)

{
  StrictSnapshotMockPtr *snapshot;
  TableauPileMock *this_00;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_01;
  Solitaire *this_02;
  char *message;
  InSequence seq;
  AssertionResult gtest_ar;
  InSequence local_b9;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_b8;
  _Any_data local_98;
  code *local_88;
  undefined1 local_78 [8];
  VTable *local_70;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_60;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_48;
  testing local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  PileId local_1c;
  
  testing::InSequence::InSequence(&local_b9);
  snapshot = &(this->super_SolitaireEmptyHandTest).snapshotMock;
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
            (&this->super_SolitaireEmptyHandTest,
             (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock,snapshot);
  this_00 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)local_78,2);
  piles::TableauPileMock::gmock_tryPullOutCards(&local_b8,this_00,(Matcher<unsigned_int> *)local_78)
  ;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x138,"lastTableauPileMock","tryPullOutCards(quantityToPullOut)");
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_48,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (local_30,&local_48);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
              *)&local_98,(ReturnAction *)local_30);
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::WillOnce(this_01,(Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
                      *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_b8.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)local_78);
  SolitaireEmptyHandTest::expectSavingSourcePileSnapshot
            (&this->super_SolitaireEmptyHandTest,snapshot);
  this_02 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  local_1c.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryPullOutCardsFromTableauPile(this_02,&local_1c,2);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_b8,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_60,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_b8);
  if (local_b8.function_mocker_ !=
      (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
       *)0x0) {
    operator_delete(local_b8.function_mocker_,
                    (long)local_b8.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>
                          .super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl
                          .super_MatcherBase<unsigned_int>.vtable_ - (long)local_b8.function_mocker_
                   );
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_b8,
             &local_60);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_98,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_b8);
  if (local_b8.function_mocker_ !=
      (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
       *)0x0) {
    operator_delete(local_b8.function_mocker_,
                    (long)local_b8.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>
                          .super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl
                          .super_MatcherBase<unsigned_int>.vtable_ - (long)local_b8.function_mocker_
                   );
  }
  Solitaire::getCardsInHand(this_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_78,local_98._M_pod_data,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  if (local_98._M_unused._M_object != (void *)0x0) {
    operator_delete(local_98._M_unused._M_object,(long)local_88 - local_98._0_8_);
  }
  if (local_60.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (local_70 == (VTable *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&local_70->match_and_explain)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x13d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_b8.function_mocker_ !=
        (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
         *)0x0) {
      (*((local_b8.function_mocker_)->super_UntypedFunctionMockerBase).
        _vptr_UntypedFunctionMockerBase[1])();
    }
  }
  if (local_70 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  testing::InSequence::~InSequence(&local_b9);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardsFromTableauPile) {
    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(twoCards));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}